

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

string * __thiscall
slang::ast::TypePrinter::toString_abi_cxx11_(string *__return_storage_ptr__,TypePrinter *this)

{
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_RDX;
  
  ::fmt::v11::to_string<500ul>
            (__return_storage_ptr__,
             (v11 *)(this->buffer)._M_t.
                    super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                    .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,in_RDX);
  return __return_storage_ptr__;
}

Assistant:

std::string TypePrinter::toString() const {
    return buffer->str();
}